

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateEntityReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::CreateEntityReliablePdu::CreateEntityReliablePdu(CreateEntityReliablePdu *this)

{
  CreateEntityReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__CreateEntityReliablePdu_00271870;
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_requestID = 0;
  Pdu::setPduType((Pdu *)this,'3');
  return;
}

Assistant:

CreateEntityReliablePdu::CreateEntityReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _requestID(0)
{
    setPduType( 51 );
}